

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::arrayStr<tcu::Vector<int,2>,5>
          (string *__return_storage_ptr__,Functional *this,Vector<int,_2> (*arr) [5])

{
  char *__lhs;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30;
  int i;
  allocator<char> local_1a;
  undefined1 local_19;
  Functional *local_18;
  Vector<int,_2> (*arr_local) [5];
  string *result;
  
  local_19 = 0;
  local_18 = this;
  arr_local = (Vector<int,_2> (*) [5])__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"{ ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
    __lhs = "";
    if (0 < (long)local_30) {
      __lhs = ", ";
    }
    de::toString<tcu::Vector<int,2>>
              (&local_70,(de *)(local_18 + (long)local_30 * 8),(Vector<int,_2> *)0x2a4b1eb);
    std::operator+(&local_50,__lhs,&local_70);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," }");
  return __return_storage_ptr__;
}

Assistant:

static string arrayStr (const T (&arr)[Size])
{
	string result = "{ ";
	for (int i = 0; i < Size; i++)
		result += (i > 0 ? ", " : "") + toString(arr[i]);
	result += " }";
	return result;
}